

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

DataAddress * __thiscall
Rml::DataExpressionInterface::ParseAddress
          (DataAddress *__return_storage_ptr__,DataExpressionInterface *this,String *address_str)

{
  char *pcVar1;
  long lVar2;
  initializer_list<Rml::DataAddressEntry> __l;
  allocator_type local_b2;
  allocator<char> local_b1;
  String local_b0;
  String local_90;
  DataAddressEntry local_70;
  DataAddressEntry local_48;
  
  if ((((address_str->_M_string_length < 4) ||
       (pcVar1 = (address_str->_M_dataplus)._M_p, *pcVar1 != 'e')) || (pcVar1[1] != 'v')) ||
     (pcVar1[2] != '.')) {
    if (this->data_model == (DataModel *)0x0) {
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      DataModel::ResolveAddress(__return_storage_ptr__,this->data_model,address_str,this->element);
    }
  }
  else {
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ev",&local_b1);
    DataAddressEntry::DataAddressEntry(&local_70,&local_90);
    ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)address_str);
    DataAddressEntry::DataAddressEntry(&local_48,&local_b0);
    __l._M_len = 2;
    __l._M_array = &local_70;
    ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::vector
              (__return_storage_ptr__,__l,&local_b2);
    lVar2 = 0x28;
    do {
      ::std::__cxx11::string::~string((string *)((long)&local_70.name._M_dataplus._M_p + lVar2));
      lVar2 = lVar2 + -0x28;
    } while (lVar2 != -0x28);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

DataAddress DataExpressionInterface::ParseAddress(const String& address_str) const
{
	if (address_str.size() >= 4 && address_str[0] == 'e' && address_str[1] == 'v' && address_str[2] == '.')
		return DataAddress{DataAddressEntry("ev"), DataAddressEntry(address_str.substr(3))};

	return data_model ? data_model->ResolveAddress(address_str, element) : DataAddress();
}